

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string.h
# Opt level: O1

String * __thiscall
kj::str<kj::String&,char_const(&)[2],unsigned_int,char_const(&)[10],kj::StringPtr&,char_const(&)[2]>
          (String *__return_storage_ptr__,kj *this,String *params,char (*params_1) [2],
          uint *params_2,char (*params_3) [10],StringPtr *params_4,char (*params_5) [2])

{
  long lVar1;
  ArrayPtr<const_char> *in_stack_ffffffffffffff60;
  long local_98;
  long local_90;
  ArrayPtr<const_char> local_88;
  ArrayPtr<const_char> local_78;
  undefined1 local_68 [16];
  ArrayPtr<const_char> local_58;
  CappedArray<char,_14UL> local_48;
  
  lVar1 = *(long *)(this + 8);
  local_98 = lVar1;
  if (lVar1 != 0) {
    local_98 = *(long *)this;
  }
  local_90 = 0;
  if (lVar1 != 0) {
    local_90 = lVar1 + -1;
  }
  local_58.size_ = strlen((char *)params);
  local_58.ptr = (char *)params;
  _::Stringifier::operator*(&local_48,(Stringifier *)&_::STR,*(uint *)params_1);
  local_68._8_8_ = strlen((char *)params_2);
  local_78.ptr = *(char **)*params_3;
  local_78.size_ = *(long *)(*params_3 + 8) - 1;
  local_68._0_8_ = params_2;
  local_88.size_ = strlen((char *)params_4);
  local_88.ptr = (char *)params_4;
  _::
  concat<kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::CappedArray<char,14ul>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>>
            (__return_storage_ptr__,(_ *)&local_98,&local_58,(ArrayPtr<const_char> *)&local_48,
             (CappedArray<char,_14UL> *)local_68,&local_78,&local_88,in_stack_ffffffffffffff60);
  return __return_storage_ptr__;
}

Assistant:

String str(Params&&... params) {
  // Magic function which builds a string from a bunch of arbitrary values.  Example:
  //     str(1, " / ", 2, " = ", 0.5)
  // returns:
  //     "1 / 2 = 0.5"
  // To teach `str` how to stringify a type, see `Stringifier`.

  return _::concat(toCharSequence(kj::fwd<Params>(params))...);
}